

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O2

Gia_Man_t * Gia_ManRetimeDupForward(Gia_Man_t *p,Vec_Ptr_t *vCut)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  undefined8 *puVar5;
  Gia_Obj_t *pGVar6;
  uint *puVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  Gia_ManSetPhase(p);
  p->pObjs->Value = 0;
  for (iVar9 = 0; iVar9 < p->vCis->nSize - p->nRegs; iVar9 = iVar9 + 1) {
    pGVar4 = Gia_ManCi(p,iVar9);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  for (iVar9 = 0; iVar9 < vCut->nSize; iVar9 = iVar9 + 1) {
    puVar5 = (undefined8 *)Vec_PtrEntry(vCut,iVar9);
    iVar2 = Gia_ManAppendCi(p_00);
    iVar2 = Abc_LitNotCond(iVar2,(uint)((ulong)*puVar5 >> 0x3f));
    *(int *)(puVar5 + 1) = iVar2;
  }
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar4 = Gia_ManCo(p,iVar9);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ManRetimeDup_rec(p_00,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
  }
  for (iVar9 = 0; iVar9 < p->vCos->nSize - p->nRegs; iVar9 = iVar9 + 1) {
    pGVar4 = Gia_ManCo(p,iVar9);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    Gia_ManAppendCo(p_00,iVar2);
  }
  for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjFanin0Copy(pGVar4);
    pGVar4->Value = uVar1;
  }
  for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    pGVar6->Value = pGVar4->Value;
  }
  for (iVar9 = 0; iVar2 = vCut->nSize, iVar9 < iVar2; iVar9 = iVar9 + 1) {
    puVar7 = (uint *)Vec_PtrEntry(vCut,iVar9);
    if ((~*puVar7 & 0x1fffffff) != 0 && -1 < (int)*puVar7) {
      puVar7[2] = 0xffffffff;
    }
  }
  for (iVar9 = 0; iVar9 < iVar2; iVar9 = iVar9 + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vCut,iVar9);
    Gia_ManRetimeDup_rec(p_00,pGVar4);
    iVar2 = Abc_LitNotCond(pGVar4->Value,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f));
    Gia_ManAppendCo(p_00,iVar2);
    iVar2 = vCut->nSize;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,vCut->nSize);
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManRetimeDupForward( Gia_Man_t * p, Vec_Ptr_t * vCut )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // create the true PIs
    Gia_ManFillValue( p );
    Gia_ManSetPhase( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), pObj->fPhase );
    // duplicate logic above the cut
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManRetimeDup_rec( pNew, Gia_ObjFanin0(pObj) );
    // create the true POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // remember value in LI
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // transfer values from the LIs to the LOs
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
        pObjRo->Value = pObjRi->Value;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = ~0;
    // duplicate logic below the cut
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
    {
        Gia_ManRetimeDup_rec( pNew, pObj );
        Gia_ManAppendCo( pNew, Abc_LitNotCond( pObj->Value, pObj->fPhase ) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vCut) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}